

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O0

size_t __thiscall
asio::detail::reactive_socket_service<asio::ip::udp>::receive_from<asio::mutable_buffers_1>
          (reactive_socket_service<asio::ip::udp> *this,implementation_type *impl,
          mutable_buffers_1 *buffers,endpoint_type *sender_endpoint,message_flags flags,
          error_code *ec)

{
  ulong uVar1;
  state_type state;
  socket_type s;
  bool bVar2;
  size_t sVar3;
  size_t *in_RCX;
  error_code *in_RDX;
  error_code *in_R9;
  mutable_buffer mVar4;
  size_t n;
  size_t addr_len;
  undefined1 *new_size;
  error_code *this_00;
  void *addr;
  undefined1 auVar5 [12];
  void *in_stack_ffffffffffffffc0;
  undefined1 local_38 [3];
  
  _local_38 = asio::ip::basic_endpoint<asio::ip::udp>::capacity
                        ((basic_endpoint<asio::ip::udp> *)0x4a1dd8);
  mVar4 = buffer_sequence_adapter<asio::mutable_buffer,_asio::mutable_buffers_1>::first
                    ((mutable_buffers_1 *)in_RDX);
  auVar5 = mVar4._4_12_;
  mutable_buffer::data((mutable_buffer *)&stack0xffffffffffffffb0);
  mVar4 = buffer_sequence_adapter<asio::mutable_buffer,_asio::mutable_buffers_1>::first
                    ((mutable_buffers_1 *)in_RDX);
  addr = (void *)mVar4.size_;
  mutable_buffer::size((mutable_buffer *)&stack0xffffffffffffffa0);
  asio::ip::basic_endpoint<asio::ip::udp>::data((basic_endpoint<asio::ip::udp> *)0x4a1e58);
  sVar3 = _local_38;
  new_size = local_38;
  uVar1 = _local_38 >> 0x20;
  s = (socket_type)uVar1;
  state = (state_type)(sVar3 >> 0x18);
  this_00 = in_R9;
  _local_38 = sVar3;
  sVar3 = socket_ops::sync_recvfrom1
                    (s,state,in_stack_ffffffffffffffc0,auVar5._4_8_,auVar5._0_4_,addr,in_RCX,in_RDX)
  ;
  bVar2 = std::error_code::operator_cast_to_bool(in_R9);
  if (!bVar2) {
    asio::ip::basic_endpoint<asio::ip::udp>::resize
              ((basic_endpoint<asio::ip::udp> *)this_00,(size_t)new_size);
  }
  return sVar3;
}

Assistant:

size_t receive_from(implementation_type& impl,
      const MutableBufferSequence& buffers,
      endpoint_type& sender_endpoint, socket_base::message_flags flags,
      asio::error_code& ec)
  {
    typedef buffer_sequence_adapter<asio::mutable_buffer,
        MutableBufferSequence> bufs_type;

    std::size_t addr_len = sender_endpoint.capacity();
    std::size_t n;
    if (bufs_type::is_single_buffer)
    {
      n = socket_ops::sync_recvfrom1(impl.socket_, impl.state_,
          bufs_type::first(buffers).data(), bufs_type::first(buffers).size(),
          flags, sender_endpoint.data(), &addr_len, ec);
    }
    else
    {
      bufs_type bufs(buffers);
      n = socket_ops::sync_recvfrom(impl.socket_, impl.state_, bufs.buffers(),
          bufs.count(), flags, sender_endpoint.data(), &addr_len, ec);
    }

    if (!ec)
      sender_endpoint.resize(addr_len);

    ASIO_ERROR_LOCATION(ec);
    return n;
  }